

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_tointegerns(TValue *obj,lua_Integer *p,F2Imod mode)

{
  F2Imod mode_local;
  lua_Integer *p_local;
  TValue *obj_local;
  
  if (obj->tt_ == 3) {
    if (obj->tt_ != 3) {
      __assert_fail("((((obj))->tt_) == (((3) | ((0) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x8b,"int luaV_tointegerns(const TValue *, lua_Integer *, F2Imod)");
    }
    obj_local._4_4_ = luaV_flttointeger((obj->value_).n,p,mode);
  }
  else if (obj->tt_ == 0x13) {
    if (obj->tt_ != 0x13) {
      __assert_fail("((((obj))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x8d,"int luaV_tointegerns(const TValue *, lua_Integer *, F2Imod)");
    }
    *p = (lua_Integer)obj->value_;
    obj_local._4_4_ = 1;
  }
  else {
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

int luaV_tointegerns (const TValue *obj, lua_Integer *p, F2Imod mode) {
  if (ttisfloat(obj))
    return luaV_flttointeger(fltvalue(obj), p, mode);
  else if (ttisinteger(obj)) {
    *p = ivalue(obj);
    return 1;
  }
  else
    return 0;
}